

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_create_type.cpp
# Opt level: O2

Vector * __thiscall
duckdb::Transformer::PGListToVector
          (Vector *__return_storage_ptr__,Transformer *this,
          optional_ptr<duckdb_libpgquery::PGList,_true> column_list,idx_t *size)

{
  data_ptr_t pdVar1;
  PGList *pPVar2;
  PGAConst *pPVar3;
  ParserException *this_00;
  idx_t iVar4;
  Vector *result;
  string_t sVar5;
  allocator local_a1;
  Vector *local_a0;
  optional_ptr<duckdb_libpgquery::PGList,_true> column_list_local;
  anon_union_16_2_67f50693_for_value local_90;
  string entry_value;
  LogicalType local_60;
  LogicalType local_48;
  
  local_a0 = __return_storage_ptr__;
  column_list_local = column_list;
  if (column_list.ptr == (PGList *)0x0) {
    LogicalType::LogicalType(&local_48,VARCHAR);
    Vector::Vector(__return_storage_ptr__,&local_48,0x800);
    LogicalType::~LogicalType(&local_48);
  }
  else {
    pPVar2 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&column_list_local);
    iVar4 = *size;
    while( true ) {
      iVar4 = iVar4 + 1;
      pPVar2 = (PGList *)pPVar2->head;
      if (pPVar2 == (PGList *)0x0) break;
      *size = iVar4;
    }
    LogicalType::LogicalType(&local_60,VARCHAR);
    Vector::Vector(__return_storage_ptr__,&local_60,*size);
    LogicalType::~LogicalType(&local_60);
    pdVar1 = __return_storage_ptr__->data;
    *size = 0;
    pPVar2 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&column_list_local);
    while (pPVar2 = (PGList *)pPVar2->head, pPVar2 != (PGList *)0x0) {
      entry_value._M_dataplus._M_p = *(pointer *)pPVar2;
      pPVar3 = optional_ptr<duckdb_libpgquery::PGAConst,_true>::operator*
                         ((optional_ptr<duckdb_libpgquery::PGAConst,_true> *)&entry_value);
      if ((pPVar3->val).type != T_PGString) {
        this_00 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&entry_value,"Expected a string constant as value",&local_a1);
        ParserException::ParserException(this_00,&entry_value);
        __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::string((string *)&entry_value,(pPVar3->val).val.str,&local_a1);
      string_t::string_t((string_t *)&local_90.pointer,&entry_value);
      sVar5.value.pointer.ptr = (char *)iVar4;
      sVar5.value._0_8_ = local_90.pointer.ptr;
      sVar5 = StringVector::AddStringOrBlob((StringVector *)local_a0,(Vector *)local_90._0_8_,sVar5)
      ;
      iVar4 = *size;
      *size = iVar4 + 1;
      iVar4 = iVar4 * 0x10;
      *(long *)(pdVar1 + iVar4) = sVar5.value._0_8_;
      *(long *)(pdVar1 + iVar4 + 8) = sVar5.value._8_8_;
      ::std::__cxx11::string::~string((string *)&entry_value);
    }
  }
  return local_a0;
}

Assistant:

Vector Transformer::PGListToVector(optional_ptr<duckdb_libpgquery::PGList> column_list, idx_t &size) {
	if (!column_list) {
		Vector result(LogicalType::VARCHAR);
		return result;
	}
	// First we discover the size of this list
	for (auto c = column_list->head; c != nullptr; c = lnext(c)) {
		size++;
	}

	Vector result(LogicalType::VARCHAR, size);
	auto result_ptr = FlatVector::GetData<string_t>(result);

	size = 0;
	for (auto c = column_list->head; c != nullptr; c = lnext(c)) {
		auto &type_val = *PGPointerCast<duckdb_libpgquery::PGAConst>(c->data.ptr_value);
		auto &entry_value_node = type_val.val;
		if (entry_value_node.type != duckdb_libpgquery::T_PGString) {
			throw ParserException("Expected a string constant as value");
		}

		auto entry_value = string(entry_value_node.val.str);
		D_ASSERT(!entry_value.empty());
		result_ptr[size++] = StringVector::AddStringOrBlob(result, entry_value);
	}
	return result;
}